

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

int soundfiler_writeascii(t_soundfiler *x,char *filename,t_asciiargs *a)

{
  int iVar1;
  _binbuf *x_00;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char path [1000];
  char acStack_418 [1000];
  
  x_00 = binbuf_new();
  canvas_makefilename(x->x_canvas,filename,acStack_418,1000);
  if (200000 < a->aa_nframes) {
    post("warning: writing %d table points to ascii file!");
  }
  lVar5 = 0;
  if (0 < a->aa_nframes) {
    lVar2 = (long)(int)a->aa_onsetframe;
    lVar5 = 0;
    do {
      if (0 < a->aa_nchannels) {
        lVar3 = 0;
        do {
          binbuf_addv(x_00,"f",(double)(a->aa_vectors[lVar3][lVar2].w_float * a->aa_normfactor));
          lVar3 = lVar3 + 1;
        } while (lVar3 < a->aa_nchannels);
      }
      lVar5 = lVar5 + 1;
      lVar2 = lVar2 + 1;
    } while (lVar5 < a->aa_nframes);
  }
  binbuf_addv(x_00,";");
  iVar1 = binbuf_write(x_00,acStack_418,"",1);
  binbuf_free(x_00);
  iVar4 = (int)lVar5;
  if (iVar1 != 0) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int soundfiler_writeascii(t_soundfiler *x, const char *filename, t_asciiargs *a)
{
    char path[MAXPDSTRING];
    t_binbuf *b = binbuf_new();
    int i, j, frameswritten = 0, ret = 1;
#ifdef DEBUG_SOUNDFILE
    post("ascii write: frames %d onset %d channels %d",
        a->aa_nframes, a->aa_onsetframe, a->aa_nchannels);
#endif
    canvas_makefilename(x->x_canvas, filename, path, MAXPDSTRING);
    if (a->aa_nframes > 200000)
        post("warning: writing %d table points to ascii file!");
    for (i = a->aa_onsetframe; frameswritten < a->aa_nframes; ++i)
    {
        for (j = 0; j < a->aa_nchannels; ++j)
            binbuf_addv(b, "f", a->aa_vectors[j][i].w_float * a->aa_normfactor);
        frameswritten++;
    }
    binbuf_addv(b, ";");
    ret = binbuf_write(b, path, "", 1); /* convert semis to cr */
    binbuf_free(b);
    return (ret == 0 ? frameswritten : 0);
}